

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cf95::ArenaTest_FuzzFuseFuseRace_Test::TestBody
          (ArenaTest_FuzzFuseFuseRace_Test *this)

{
  pointer ptVar1;
  pointer __last;
  size_type __n;
  pointer __result;
  thread *ptVar2;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX;
  anon_class_16_2_625d3fb6_for__M_head_impl *__args;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_625d3fb6_for__M_head_impl *__args_00;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX_01;
  thread *t;
  pointer ptVar3;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  int iVar4;
  bool bVar5;
  Time TVar6;
  Time TVar7;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Notification done;
  BitGen gen;
  Environment env;
  
  memset(&env,0,0x648);
  done.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  done.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 10;
  __args = extraout_RDX;
  while( true ) {
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) break;
    gen.urbg_.raw_state_._0_8_ = &done;
    gen.urbg_.raw_state_._8_8_ = &env;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      (&threads,1,"vector::_M_realloc_insert");
      __last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            __n);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFuseRace_Test::TestBody()::__0>
                ((allocator_type *)(((long)ptVar1 - (long)ptVar3) + (long)__result),(thread *)&gen,
                 __args_00);
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar3,ptVar1,__result,(allocator<std::thread> *)&threads);
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar1,__last,ptVar2 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,ptVar3,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar3 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + __n;
      __args = extraout_RDX_01;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar2;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFuseRace_Test::TestBody()::__0>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)&gen,__args);
      __args = extraout_RDX_00;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  absl::lts_20250127::random_internal::
  NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
  ::ConstructURBG();
  TVar6 = absl::lts_20250127::Now();
  TVar6 = absl::lts_20250127::operator+(TVar6,(Duration)ZEXT812(2));
  do {
    TVar7 = absl::lts_20250127::Now();
    if (TVar7.rep_.rep_hi_ == TVar6.rep_.rep_hi_) {
      if (TVar6.rep_.rep_lo_ <= TVar7.rep_.rep_lo_) goto LAB_00147d2a;
    }
    else if ((long)TVar6.rep_.rep_hi_ <= (long)TVar7.rep_.rep_hi_) {
LAB_00147d2a:
      absl::lts_20250127::Notification::Notify(&done);
      ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      absl::lts_20250127::Notification::~Notification(&done);
      Environment::~Environment(&env);
      return;
    }
    Environment::RandomFuse(&env,&gen);
  } while( true );
}

Assistant:

TEST(ArenaTest, FuzzFuseFuseRace) {
  Environment env;

  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 10; ++i) {
    threads.emplace_back([&]() {
      absl::BitGen gen;
      while (!done.HasBeenNotified()) {
        env.RandomFuse(gen);
      }
    });
  }

  absl::BitGen gen;
  auto end = absl::Now() + absl::Seconds(2);
  while (absl::Now() < end) {
    env.RandomFuse(gen);
  }
  done.Notify();
  for (auto& t : threads) t.join();
}